

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_properties.h
# Opt level: O2

bool __thiscall BamTools::PropertyFilterValue::check(PropertyFilterValue *this,string *query)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ostream *poVar3;
  long lVar4;
  
  bVar1 = Variant::is_type<std::__cxx11::string>(&this->Value);
  if (bVar1) {
    __rhs = Variant::get<std::__cxx11::string>(&this->Value);
    switch(this->Type) {
    case CONTAINS:
      lVar4 = std::__cxx11::string::find((string *)query,(ulong)__rhs);
      bVar1 = lVar4 != -1;
      break;
    case ENDS_WITH:
      lVar4 = std::__cxx11::string::find((string *)query,(ulong)__rhs);
      bVar1 = lVar4 == query->_M_string_length - __rhs->_M_string_length;
      break;
    case EXACT:
      _Var2 = std::operator==(query,__rhs);
      return _Var2;
    case GREATER_THAN:
      bVar1 = std::operator>(query,__rhs);
      return bVar1;
    case GREATER_THAN_EQUAL:
      bVar1 = std::operator>=(query,__rhs);
      return bVar1;
    case LESS_THAN:
      bVar1 = std::operator<(query,__rhs);
      return bVar1;
    case LESS_THAN_EQUAL:
      bVar1 = std::operator<=(query,__rhs);
      return bVar1;
    case NOT:
      bVar1 = std::operator!=(query,__rhs);
      return bVar1;
    case STARTS_WITH:
      lVar4 = std::__cxx11::string::find((string *)query,(ulong)__rhs);
      bVar1 = lVar4 == 0;
      break;
    default:
      goto switchD_00170a3f_default;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot compare different types!");
    std::endl<char,std::char_traits<char>>(poVar3);
switchD_00170a3f_default:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool PropertyFilterValue::check(const std::string& query) const
{

    // ensure filter value & query are same type
    if (!Value.is_type<std::string>()) {
        std::cerr << "Cannot compare different types!" << std::endl;
        return false;
    }

    // localize string version of our filter value
    const std::string& valueString = Value.get<std::string>();

    // string matching based on our filter type
    switch (Type) {
        case (PropertyFilterValue::CONTAINS):
            return (query.find(valueString) != std::string::npos);
        case (PropertyFilterValue::ENDS_WITH):
            return (query.find(valueString) == (query.length() - valueString.length()));
        case (PropertyFilterValue::EXACT):
            return (query == valueString);
        case (PropertyFilterValue::GREATER_THAN):
            return (query > valueString);
        case (PropertyFilterValue::GREATER_THAN_EQUAL):
            return (query >= valueString);
        case (PropertyFilterValue::LESS_THAN):
            return (query < valueString);
        case (PropertyFilterValue::LESS_THAN_EQUAL):
            return (query <= valueString);
        case (PropertyFilterValue::NOT):
            return (query != valueString);
        case (PropertyFilterValue::STARTS_WITH):
            return (query.find(valueString) == 0);
        default:
            BAMTOOLS_ASSERT_UNREACHABLE;
    }
    return false;
}